

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

TriQuadMesh * pbrt::TriQuadMesh::ReadPLY(TriQuadMesh *__return_storage_ptr__,string *filename)

{
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *this;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *this_00;
  undefined8 __s1;
  int iVar1;
  p_ply ply;
  p_ply_element last;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 auVar6 [64];
  long nInstances;
  size_type local_90;
  size_type local_88;
  string *local_80;
  int local_74;
  FaceCallbackContext context;
  
  auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->faceIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar6;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->uv).
    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar6;
  __return_storage_ptr__->p =
       (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)auVar6._0_24_;
  __return_storage_ptr__->n =
       (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>)auVar6._24_24_;
  (__return_storage_ptr__->uv).
  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar6._48_8_;
  (__return_storage_ptr__->uv).
  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar6._56_8_;
  ply = ply_open((filename->_M_dataplus)._M_p,rply_message_callback,0,(void *)0x0);
  local_80 = filename;
  if (ply == (p_ply)0x0) {
    pcVar5 = "Couldn\'t open PLY file \"%s\"";
  }
  else {
    iVar1 = ply_read_header(ply);
    if (iVar1 != 0) {
      last = (p_ply_element)0x0;
      local_88 = 0;
      local_90 = 0;
      while (last = ply_get_next_element(ply,last), last != (p_ply_element)0x0) {
        ply_get_element_info(last,(char **)&context,&nInstances);
        __s1 = context.face._0_8_;
        iVar1 = strcmp((char *)context.face._0_8_,"vertex");
        if (iVar1 == 0) {
          local_88 = CONCAT44(nInstances._4_4_,(int)nInstances);
        }
        else {
          iVar1 = strcmp((char *)__s1,"face");
          if (iVar1 == 0) {
            local_90 = CONCAT44(nInstances._4_4_,(int)nInstances);
          }
        }
      }
      pcVar5 = "%s: PLY file is invalid! No face/vertex elements found!";
      if ((local_88 != 0) && (local_90 != 0)) {
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                  (&__return_storage_ptr__->p,local_88);
        lVar2 = ply_set_read_cb(ply,"vertex","x",rply_vertex_callback,
                                (__return_storage_ptr__->p).
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,0x30);
        pcVar5 = "%s: Vertex coordinate property not found!";
        if ((lVar2 != 0) &&
           ((lVar2 = ply_set_read_cb(ply,"vertex","y",rply_vertex_callback,
                                     (__return_storage_ptr__->p).
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0x31), lVar2 != 0 &&
            (lVar2 = ply_set_read_cb(ply,"vertex","z",rply_vertex_callback,
                                     (__return_storage_ptr__->p).
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0x32), lVar2 != 0))))
        {
          this = &__return_storage_ptr__->n;
          std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
                    (this,local_88);
          lVar2 = ply_set_read_cb(ply,"vertex","nx",rply_vertex_callback,
                                  (this->
                                  super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,0x30);
          if (((lVar2 == 0) ||
              (lVar2 = ply_set_read_cb(ply,"vertex","ny",rply_vertex_callback,
                                       (this->
                                       super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,0x31), lVar2 == 0)
              ) || (lVar2 = ply_set_read_cb(ply,"vertex","nz",rply_vertex_callback,
                                            (this->
                                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start,0x32),
                   lVar2 == 0)) {
            std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
                      (this,0);
          }
          this_00 = &__return_storage_ptr__->uv;
          std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
                    (this_00,local_88);
          lVar2 = ply_set_read_cb(ply,"vertex","u",rply_vertex_callback,
                                  (this_00->
                                  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,0x20);
          if (((((lVar2 == 0) ||
                (lVar2 = ply_set_read_cb(ply,"vertex","v",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x21),
                lVar2 == 0)) &&
               ((lVar2 = ply_set_read_cb(ply,"vertex","s",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x20),
                lVar2 == 0 ||
                (lVar2 = ply_set_read_cb(ply,"vertex","t",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x21),
                lVar2 == 0)))) &&
              ((lVar2 = ply_set_read_cb(ply,"vertex","texture_u",rply_vertex_callback,
                                        (this_00->
                                        super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start,0x20), lVar2 == 0
               || (lVar2 = ply_set_read_cb(ply,"vertex","texture_v",rply_vertex_callback,
                                           (this_00->
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start,0x21),
                  lVar2 == 0)))) &&
             ((lVar2 = ply_set_read_cb(ply,"vertex","texture_s",rply_vertex_callback,
                                       (this_00->
                                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,0x20), lVar2 == 0
              || (lVar2 = ply_set_read_cb(ply,"vertex","texture_t",rply_vertex_callback,
                                          (this_00->
                                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start,0x21),
                 lVar2 == 0)))) {
            std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
                      (this_00,0);
          }
          context.quadIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          context.quadIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          context.triIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          context.triIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          context.triIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          context.quadIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::reserve(&context.triIndices,local_90 * 3);
          std::vector<int,_std::allocator<int>_>::reserve(&context.quadIndices,local_90 * 4);
          lVar2 = ply_set_read_cb(ply,"face","vertex_indices",rply_face_callback,&context,0);
          if (lVar2 == 0) {
            pcVar5 = "%s: vertex indices not found in PLY file";
          }
          else {
            lVar2 = ply_set_read_cb(ply,"face","face_indices",rply_faceindex_callback,
                                    &__return_storage_ptr__->faceIndices,0);
            if (lVar2 != 0) {
              std::vector<int,_std::allocator<int>_>::reserve
                        (&__return_storage_ptr__->faceIndices,local_90);
            }
            iVar1 = ply_read(ply);
            if (iVar1 != 0) {
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&__return_storage_ptr__->triIndices,&context.triIndices);
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&__return_storage_ptr__->quadIndices,&context.quadIndices);
              ply_close(ply);
              piVar4 = (__return_storage_ptr__->triIndices).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              uVar3 = ((long)(__return_storage_ptr__->p).
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->p).
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc;
              while( true ) {
                local_74 = (int)uVar3;
                if (piVar4 == (__return_storage_ptr__->triIndices).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish) {
                  piVar4 = (__return_storage_ptr__->quadIndices).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  while( true ) {
                    if (piVar4 == (__return_storage_ptr__->quadIndices).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish) {
                      FaceCallbackContext::~FaceCallbackContext(&context);
                      return __return_storage_ptr__;
                    }
                    nInstances._0_4_ = *piVar4;
                    if (((long)(int)nInstances < 0) || (uVar3 <= (ulong)(long)(int)nInstances))
                    break;
                    piVar4 = piVar4 + 1;
                  }
                  ErrorExit<int&,int>("plymesh: Vertex index %i is out of bounds! Valid range is [0..%i)"
                                      ,(int *)&nInstances,&local_74);
                }
                nInstances._0_4_ = *piVar4;
                if (((long)(int)nInstances < 0) || (uVar3 <= (ulong)(long)(int)nInstances)) break;
                piVar4 = piVar4 + 1;
              }
              ErrorExit<int&,int>("plymesh: Vertex index %i is out of bounds! Valid range is [0..%i)"
                                  ,(int *)&nInstances,&local_74);
            }
            pcVar5 = "%s: unable to read the contents of PLY file";
          }
          ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
        }
      }
      ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
    }
    pcVar5 = "Unable to read the header of PLY file \"%s\"";
  }
  ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
}

Assistant:

TriQuadMesh TriQuadMesh::ReadPLY(const std::string &filename) {
    TriQuadMesh mesh;

    p_ply ply = ply_open(filename.c_str(), rply_message_callback, 0, nullptr);
    if (ply == nullptr)
        ErrorExit("Couldn't open PLY file \"%s\"", filename);

    if (ply_read_header(ply) == 0)
        ErrorExit("Unable to read the header of PLY file \"%s\"", filename);

    p_ply_element element = nullptr;
    size_t vertexCount = 0, faceCount = 0;

    /* Inspect the structure of the PLY file */
    while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char *name;
        long nInstances;

        ply_get_element_info(element, &name, &nInstances);
        if (strcmp(name, "vertex") == 0)
            vertexCount = nInstances;
        else if (strcmp(name, "face") == 0)
            faceCount = nInstances;
    }

    if (vertexCount == 0 || faceCount == 0)
        ErrorExit("%s: PLY file is invalid! No face/vertex elements found!", filename);

    mesh.p.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback, mesh.p.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback, mesh.p.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback, mesh.p.data(), 0x32) ==
            0) {
        ErrorExit("%s: Vertex coordinate property not found!", filename);
    }

    mesh.n.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback, mesh.n.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback, mesh.n.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback, mesh.n.data(), 0x32) ==
            0)
        mesh.n.resize(0);

    /* There seem to be lots of different conventions regarding UV coordinate
     * names */
    mesh.uv.resize(vertexCount);
    if (((ply_set_read_cb(ply, "vertex", "u", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "v", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "s", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "t", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_u", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_v", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_s", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_t", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)))
        ;
    else
        mesh.uv.resize(0);

    FaceCallbackContext context;
    context.triIndices.reserve(faceCount * 3);
    context.quadIndices.reserve(faceCount * 4);
    if (ply_set_read_cb(ply, "face", "vertex_indices", rply_face_callback, &context, 0) ==
        0)
        ErrorExit("%s: vertex indices not found in PLY file", filename);

    if (ply_set_read_cb(ply, "face", "face_indices", rply_faceindex_callback,
                        &mesh.faceIndices, 0) != 0)
        mesh.faceIndices.reserve(faceCount);

    if (ply_read(ply) == 0)
        ErrorExit("%s: unable to read the contents of PLY file", filename);

    mesh.triIndices = std::move(context.triIndices);
    mesh.quadIndices = std::move(context.quadIndices);

    ply_close(ply);

    for (int idx : mesh.triIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));
    for (int idx : mesh.quadIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));

    return mesh;
}